

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O3

void Rml::ElementStyle::TransitionPropertyChanges
               (Element *element,PropertyIdSet *properties,PropertyDictionary *inline_properties,
               ElementDefinition *old_definition,ElementDefinition *new_definition)

{
  undefined8 *puVar1;
  Transition *pTVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  Property *pPVar6;
  PropertyIdSet *this;
  Property *pPVar7;
  Transition *transition_1;
  ulong __position;
  Transition *transition_00;
  PropertyIdSetIterator PVar8;
  Transition transition;
  Transition local_58;
  
  if ((element == (Element *)0x0) &&
     (bVar4 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementStyle.cpp"
                     ,0x75), !bVar4)) {
LAB_0022d242:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  if ((new_definition != (ElementDefinition *)0x0 && old_definition != (ElementDefinition *)0x0) &&
     (((((properties->defined_ids).super__Base_bitset<2UL>._M_w[1] != 0 ||
         (properties->defined_ids).super__Base_bitset<2UL>._M_w[0] != 0 &&
        (pPVar6 = GetLocalProperty(Transition,inline_properties,new_definition),
        pPVar6 != (Property *)0x0)) && ((pPVar6->value).type == TRANSITIONLIST)) &&
      ((pPVar6->value).data[0] == '\0')))) {
    if ((TransitionPropertyChanges(Rml::Element*,Rml::PropertyIdSet&,Rml::PropertyDictionary_const&,Rml::ElementDefinition_const*,Rml::ElementDefinition_const*)
         ::empty_properties == '\0') &&
       (iVar5 = __cxa_guard_acquire(&TransitionPropertyChanges(Rml::Element*,Rml::PropertyIdSet&,Rml::PropertyDictionary_const&,Rml::ElementDefinition_const*,Rml::ElementDefinition_const*)
                                     ::empty_properties), iVar5 != 0)) {
      PropertyDictionary::PropertyDictionary(&TransitionPropertyChanges::empty_properties);
      __cxa_atexit(PropertyDictionary::~PropertyDictionary,
                   &TransitionPropertyChanges::empty_properties,&__dso_handle);
      __cxa_guard_release(&TransitionPropertyChanges(Rml::Element*,Rml::PropertyIdSet&,Rml::PropertyDictionary_const&,Rml::ElementDefinition_const*,Rml::ElementDefinition_const*)
                           ::empty_properties);
    }
    if ((pPVar6->value).data[1] == '\x01') {
      puVar1 = *(undefined8 **)((pPVar6->value).data + 8);
      local_58._32_8_ = puVar1[4];
      local_58._0_8_ = *puVar1;
      local_58.tween._0_8_ = puVar1[1];
      local_58.tween.callback = (CallbackFnc)puVar1[2];
      local_58._24_8_ = puVar1[3];
      PVar8 = PropertyIdSet::begin(properties);
      __position = PVar8.id_index;
      this = PVar8.container;
      if (__position != 0x80 || this != properties) {
        do {
          local_58.id = (PropertyId)__position;
          pPVar6 = GetProperty((PropertyId)__position,element,inline_properties,old_definition);
          pPVar7 = GetProperty(local_58.id,element,&TransitionPropertyChanges::empty_properties,
                               new_definition);
          if ((pPVar7 == (Property *)0x0 || pPVar6 == (Property *)0x0) ||
             (((pPVar6->unit == pPVar7->unit &&
               (bVar4 = Variant::operator==(&pPVar6->value,&pPVar7->value), bVar4)) ||
              (bVar4 = Element::StartTransition(element,&local_58,pPVar6,pPVar7), !bVar4)))) {
            __position = __position + 1;
            if (__position < 0x80) {
              do {
                bVar4 = ::std::bitset<128UL>::test(&this->defined_ids,__position);
                if (bVar4) goto LAB_0022d180;
                __position = __position + 1;
              } while (__position != 0x80);
              goto LAB_0022d16e;
            }
          }
          else {
            if (((this != properties) || (0x7f < __position)) &&
               (bVar4 = Assert("RMLUI_ASSERT(it.container == this && it.id_index < N)",
                               "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/PropertyIdSet.h"
                               ,0x9b), !bVar4)) goto LAB_0022d242;
            ::std::bitset<128UL>::reset(&properties->defined_ids,__position);
            __position = __position + 1;
            if (__position < 0x80) {
              do {
                bVar4 = ::std::bitset<128UL>::test(&this->defined_ids,__position);
                if (bVar4) goto LAB_0022d180;
                __position = __position + 1;
              } while (__position != 0x80);
LAB_0022d16e:
              __position = 0x80;
            }
          }
LAB_0022d180:
        } while ((this != properties) || (__position != 0x80));
      }
    }
    else {
      pTVar2 = *(Transition **)((pPVar6->value).data + 0x10);
      for (transition_00 = *(Transition **)((pPVar6->value).data + 8); transition_00 != pTVar2;
          transition_00 = transition_00 + 1) {
        bVar4 = ::std::bitset<128UL>::test(&properties->defined_ids,(ulong)transition_00->id);
        if (bVar4) {
          pPVar6 = GetProperty(transition_00->id,element,inline_properties,old_definition);
          pPVar7 = GetProperty(transition_00->id,element,
                               &TransitionPropertyChanges::empty_properties,new_definition);
          if (((pPVar7 != (Property *)0x0 && pPVar6 != (Property *)0x0) &&
              ((pPVar6->unit != pPVar7->unit ||
               (bVar4 = Variant::operator==(&pPVar6->value,&pPVar7->value), !bVar4)))) &&
             (bVar4 = Element::StartTransition(element,transition_00,pPVar6,pPVar7), bVar4)) {
            PropertyIdSet::Erase(properties,transition_00->id);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ElementStyle::TransitionPropertyChanges(Element* element, PropertyIdSet& properties, const PropertyDictionary& inline_properties,
	const ElementDefinition* old_definition, const ElementDefinition* new_definition)
{
	// Apply transition to relevant properties if a transition is defined on element.
	// Properties that are part of a transition are removed from the properties list.

	RMLUI_ASSERT(element);
	if (!old_definition || !new_definition || properties.Empty())
		return;

	// We get the local property instead of the computed value here, because we want to intercept property changes even before the computed values are
	// ready. Now that we have the concept of computed values, we may want do this operation directly on them instead.
	if (const Property* transition_property = GetLocalProperty(PropertyId::Transition, inline_properties, new_definition))
	{
		if (transition_property->value.GetType() != Variant::TRANSITIONLIST)
			return;

		const TransitionList& transition_list = transition_property->value.GetReference<TransitionList>();

		if (!transition_list.none)
		{
			static const PropertyDictionary empty_properties;

			auto add_transition = [&](const Transition& transition) {
				bool transition_added = false;
				const Property* start_value = GetProperty(transition.id, element, inline_properties, old_definition);
				const Property* target_value = GetProperty(transition.id, element, empty_properties, new_definition);
				if (start_value && target_value && (*start_value != *target_value))
					transition_added = element->StartTransition(transition, *start_value, *target_value);
				return transition_added;
			};

			if (transition_list.all)
			{
				Transition transition = transition_list.transitions[0];
				for (auto it = properties.begin(); it != properties.end();)
				{
					transition.id = *it;
					if (add_transition(transition))
						it = properties.Erase(it);
					else
						++it;
				}
			}
			else
			{
				for (const Transition& transition : transition_list.transitions)
				{
					if (properties.Contains(transition.id))
					{
						if (add_transition(transition))
							properties.Erase(transition.id);
					}
				}
			}
		}
	}
}